

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::DuplicateNameChecker::visit(DuplicateNameChecker *this,Namespace *n)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  pool_ref<soul::AST::Function> *f;
  pointer ppVar7;
  pool_ref<soul::AST::StructDeclaration> *s;
  pointer ppVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  pointer ppVar12;
  DuplicateNameChecker duplicateNameChecker;
  DuplicateNameChecker local_38;
  
  ASTVisitor::visit(&this->super_ASTVisitor,n);
  local_38.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (n->super_ModuleBase).structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (n->super_ModuleBase).structures.
                super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar1; ppVar8 = ppVar8 + 1) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_38,(ppVar8->object->super_TypeDeclarationBase).name.name,
               &(ppVar8->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                super_ASTObject.context);
  }
  ppVar2 = (n->super_ModuleBase).usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = (n->super_ModuleBase).usings.
                super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_38,(ppVar9->object->super_TypeDeclarationBase).name.name,
               &(ppVar9->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                super_ASTObject.context);
  }
  ppVar3 = (n->subModules).
           super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = (n->subModules).
                 super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar3; ppVar10 = ppVar10 + 1
      ) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_38,(ppVar10->object->name).name,&(ppVar10->object->super_ASTObject).context);
  }
  ppVar4 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar11 = (n->constants).
                 super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar4; ppVar11 = ppVar11 + 1
      ) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_38,(ppVar11->object->name).name,
               &(ppVar11->object->super_Statement).super_ASTObject.context);
  }
  ppVar5 = (n->super_ModuleBase).namespaceAliases.
           super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar12 = (n->super_ModuleBase).namespaceAliases.
                 super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar5; ppVar12 = ppVar12 + 1
      ) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_38,(ppVar12->object->name).name,&(ppVar12->object->super_ASTObject).context);
  }
  ppVar6 = (n->functions).
           super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar6; ppVar7 = ppVar7 + 1) {
    soul::DuplicateNameChecker::checkWithoutAdding<soul::AST::Context&>
              (&local_38,(ppVar7->object->name).name,&ppVar7->object->nameLocation);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.names);
  return;
}

Assistant:

void visit (AST::Namespace& n) override
        {
            super::visit (n);

            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& s : n.structures)       duplicateNameChecker.check (s->name, s->context);
            for (auto& u : n.usings)           duplicateNameChecker.check (u->name, u->context);
            for (auto& m : n.subModules)       duplicateNameChecker.check (m->name, m->context);
            for (auto& c : n.constants)        duplicateNameChecker.check (c->name, c->context);
            for (auto& a : n.namespaceAliases) duplicateNameChecker.check (a->name, a->context);

            // (functions must be scanned last)
            for (auto& f : n.functions)     duplicateNameChecker.checkWithoutAdding (f->name, f->nameLocation);
        }